

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

_Bool msgpack_unpacker_flush_zone(msgpack_unpacker *mpac)

{
  char *data;
  msgpack_zone *zone;
  msgpack_zone_finalizer *pmVar1;
  _Bool _Var2;
  
  if (*(char *)((long)mpac->ctx + 8) == '\x01') {
    data = mpac->buffer;
    zone = mpac->z;
    pmVar1 = (zone->finalizer_array).tail;
    if (pmVar1 == (zone->finalizer_array).end) {
      _Var2 = msgpack_zone_push_finalizer_expand(zone,decr_count,data);
      if (!_Var2) {
        return false;
      }
    }
    else {
      pmVar1->func = decr_count;
      pmVar1->data = data;
      (zone->finalizer_array).tail = pmVar1 + 1;
    }
    *(undefined1 *)((long)mpac->ctx + 8) = 0;
    LOCK();
    *(int *)mpac->buffer = *(int *)mpac->buffer + 1;
    UNLOCK();
  }
  return true;
}

Assistant:

bool msgpack_unpacker_flush_zone(msgpack_unpacker* mpac)
{
    if(CTX_REFERENCED(mpac)) {
        if(!msgpack_zone_push_finalizer(mpac->z, decr_count, mpac->buffer)) {
            return false;
        }
        CTX_REFERENCED(mpac) = false;

        incr_count(mpac->buffer);
    }

    return true;
}